

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O0

void mark_columns_dirty(ecs_query_t *query,ecs_matched_table_t *table_data)

{
  int iVar1;
  ecs_table_t *peVar2;
  int32_t iVar3;
  void *pvVar4;
  int32_t table_column;
  ecs_sig_column_t *columns;
  int32_t count;
  int32_t i;
  ecs_table_t *table;
  ecs_matched_table_t *table_data_local;
  ecs_query_t *query_local;
  
  peVar2 = (table_data->iter_data).table;
  if ((peVar2 != (ecs_table_t *)0x0) && (peVar2->dirty_state != (int32_t *)0x0)) {
    iVar3 = ecs_vector_count((query->sig).columns);
    pvVar4 = _ecs_vector_first((query->sig).columns,0x28,0x10);
    for (columns._4_4_ = 0; columns._4_4_ < iVar3; columns._4_4_ = columns._4_4_ + 1) {
      if ((*(int *)((long)pvVar4 + (long)columns._4_4_ * 0x28 + 8) != 1) &&
         (iVar1 = (table_data->iter_data).columns[columns._4_4_], 0 < iVar1)) {
        peVar2->dirty_state[iVar1] = peVar2->dirty_state[iVar1] + 1;
      }
    }
  }
  return;
}

Assistant:

static
void mark_columns_dirty(
    ecs_query_t *query,
    ecs_matched_table_t *table_data)
{
    ecs_table_t *table = table_data->iter_data.table;

    if (table && table->dirty_state) {
        int32_t i, count = ecs_vector_count(query->sig.columns);
        ecs_sig_column_t *columns = ecs_vector_first(
            query->sig.columns, ecs_sig_column_t);

        for (i = 0; i < count; i ++) {
            if (columns[i].inout_kind != EcsIn) {
                int32_t table_column = table_data->iter_data.columns[i];
                if (table_column > 0) {
                    table->dirty_state[table_column] ++;
                }
            }
        }
    }
}